

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O0

Span<Potassco::WeightLit_t> __thiscall
Potassco::SmodelsConvert::SmData::mapLits<Potassco::WeightLit_t>
          (SmData *this,Span<Potassco::WeightLit_t> *in,
          vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_> *out)

{
  WeightLit_t *pWVar1;
  WeightLit_t in_RDX;
  Span<Potassco::WeightLit_t> *in_RSI;
  Span<Potassco::WeightLit_t> SVar2;
  iterator x;
  WeightLit_t __x;
  WeightLit_t *c;
  WeightLit_t *local_30;
  
  std::vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>::clear
            ((vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_> *)0x11e627);
  local_30 = begin<Potassco::WeightLit_t>(in_RSI);
  while( true ) {
    c = local_30;
    pWVar1 = end<Potassco::WeightLit_t>((Span<Potassco::WeightLit_t> *)0x11e64a);
    if (c == pWVar1) break;
    __x = in_RDX;
    mapLit((SmData *)0x11e67c,in_RDX);
    std::vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>::push_back
              ((vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_> *)c,
               (value_type *)__x);
    local_30 = local_30 + 1;
  }
  SVar2 = toSpan<std::vector<Potassco::WeightLit_t,std::allocator<Potassco::WeightLit_t>>>
                    ((vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_> *)c);
  return SVar2;
}

Assistant:

Span<T>  mapLits(const Span<T>& in, std::vector<T>& out) {
		out.clear();
		for (typename Span<T>::iterator x = begin(in); x != end(in); ++x) { out.push_back(mapLit(*x)); }
		return toSpan(out);
	}